

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.h
# Opt level: O2

void __thiscall FIX::FileLogFactory::FileLogFactory(FileLogFactory *this,SessionSettings *settings)

{
  *(undefined **)this = &SocketAcceptor::typeinfo;
  *(FileLogFactory **)(this + 8) = this + 0x18;
  *(undefined8 *)(this + 0x10) = 0;
  this[0x18] = (FileLogFactory)0x0;
  *(FileLogFactory **)(this + 0x28) = this + 0x38;
  *(undefined8 *)(this + 0x30) = 0;
  this[0x38] = (FileLogFactory)0x0;
  SessionSettings::SessionSettings((SessionSettings *)(this + 0x48),settings);
  *(undefined8 *)(this + 0xd8) = 0;
  *(undefined4 *)(this + 0xe0) = 0;
  return;
}

Assistant:

FileLogFactory(const SessionSettings &settings)
      : m_settings(settings),
        m_globalLog(0),
        m_globalLogCount(0) {}